

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O3

void __thiscall Assimp::ColladaParser::ReadEffectProfileCommon(ColladaParser *this,Effect *pEffect)

{
  pointer puVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  mapped_type *pmVar6;
  undefined4 extraout_var_11;
  mapped_type *pmVar7;
  undefined4 extraout_var_12;
  Sampler *pSampler;
  aiColor4D *pColor;
  ai_real *pFloat;
  char *pcVar8;
  aiColor4D dummy;
  string id;
  undefined1 local_138 [8];
  undefined8 *puStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  pointer local_118;
  pointer puStack_110;
  pointer local_108;
  undefined8 *puStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  key_type local_d8;
  Sampler *local_b8;
  ai_real *local_b0;
  ai_real *local_a8;
  ai_real *local_a0;
  ai_real *local_98;
  Sampler *local_90;
  aiColor4D *local_88;
  Sampler *local_80;
  aiColor4D *local_78;
  Sampler *local_70;
  aiColor4D *local_68;
  Sampler *local_60;
  aiColor4D *local_58;
  Sampler *local_50;
  aiColor4D *local_48;
  Sampler *local_40;
  aiColor4D *local_38;
  
  iVar3 = (*this->mReader->_vptr_IIrrXMLReader[2])();
  if ((char)iVar3 != '\0') {
    local_b8 = &pEffect->mTexBump;
    local_b0 = &pEffect->mRefractIndex;
    local_a8 = &pEffect->mTransparency;
    local_a0 = &pEffect->mReflectivity;
    local_98 = &pEffect->mShininess;
    local_88 = &pEffect->mTransparent;
    local_90 = &pEffect->mTexTransparent;
    local_78 = &pEffect->mReflective;
    local_80 = &pEffect->mTexReflective;
    local_68 = &pEffect->mSpecular;
    local_70 = &pEffect->mTexSpecular;
    local_58 = &pEffect->mDiffuse;
    local_60 = &pEffect->mTexDiffuse;
    local_48 = &pEffect->mAmbient;
    local_50 = &pEffect->mTexAmbient;
    local_38 = &pEffect->mEmissive;
    local_40 = &pEffect->mTexEmissive;
    do {
      iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      iVar4 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      if (iVar3 == 1) {
        if (iVar4 != 1) goto LAB_003f6dcd;
        iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
        iVar3 = strcmp((char *)CONCAT44(extraout_var,iVar3),"newparam");
        if (iVar3 == 0) {
          uVar5 = GetAttribute(this,"sid");
          iVar3 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar5);
          std::__cxx11::string::string
                    ((string *)&local_d8,(char *)CONCAT44(extraout_var_10,iVar3),
                     (allocator *)local_138);
          local_138 = (undefined1  [8])0x0;
          local_128 = 0;
          local_118 = (pointer)0x0;
          uStack_120 = 0;
          puStack_130 = &uStack_120;
          pmVar6 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::EffectParam,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::EffectParam>_>_>
                   ::operator[](&pEffect->mParams,&local_d8);
          pmVar6->mType = local_138._0_4_;
          std::__cxx11::string::operator=((string *)&pmVar6->mReference,(string *)&puStack_130);
          if (puStack_130 != &uStack_120) {
            operator_delete(puStack_130);
          }
          pmVar6 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::EffectParam,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::EffectParam>_>_>
                   ::operator[](&pEffect->mParams,&local_d8);
          ReadEffectParam(this,pmVar6);
LAB_003f69d1:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
            operator_delete(local_d8._M_dataplus._M_p);
          }
        }
        else {
          iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
          if (iVar3 != 1) goto LAB_003f6dcd;
          iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
          iVar3 = strcmp((char *)CONCAT44(extraout_var_00,iVar3),"technique");
          if (iVar3 != 0) {
            iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
            if (iVar3 != 1) goto LAB_003f6dcd;
            iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
            iVar3 = strcmp((char *)CONCAT44(extraout_var_01,iVar3),"extra");
            if (iVar3 != 0) {
              if (this->mFormat == FV_1_4_n) {
                iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
                if (iVar3 != 1) goto LAB_003f6dcd;
                iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
                iVar3 = strcmp((char *)CONCAT44(extraout_var_02,iVar3),"image");
                if (iVar3 == 0) {
                  uVar5 = GetAttribute(this,"id");
                  iVar3 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar5);
                  std::__cxx11::string::string
                            ((string *)&local_d8,(char *)CONCAT44(extraout_var_11,iVar3),
                             (allocator *)local_138);
                  local_138 = (undefined1  [8])&local_128;
                  local_e8 = 0;
                  local_f8 = 0;
                  local_128 = 0;
                  uStack_120 = 0;
                  puStack_130 = (undefined8 *)0x0;
                  local_108 = (pointer)0x0;
                  local_118 = (pointer)0x0;
                  puStack_110 = (pointer)0x0;
                  puStack_100 = &uStack_f0;
                  uStack_f0 = 0;
                  pmVar7 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Image,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Image>_>_>
                           ::operator[](&this->mImageLibrary,&local_d8);
                  std::__cxx11::string::operator=((string *)pmVar7,(string *)local_138);
                  puVar1 = (pmVar7->mImageData).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start;
                  (pmVar7->mImageData).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start = local_118;
                  (pmVar7->mImageData).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish = puStack_110;
                  (pmVar7->mImageData).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = local_108;
                  local_118 = (pointer)0x0;
                  puStack_110 = (pointer)0x0;
                  local_108 = (pointer)0x0;
                  if (puVar1 != (pointer)0x0) {
                    operator_delete(puVar1);
                  }
                  std::__cxx11::string::operator=
                            ((string *)&pmVar7->mEmbeddedFormat,(string *)&puStack_100);
                  if (puStack_100 != &uStack_f0) {
                    operator_delete(puStack_100);
                  }
                  if (local_118 != (pointer)0x0) {
                    operator_delete(local_118);
                  }
                  if (local_138 != (undefined1  [8])&local_128) {
                    operator_delete((void *)local_138);
                  }
                  pmVar7 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Image,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Image>_>_>
                           ::operator[](&this->mImageLibrary,&local_d8);
                  ReadImage(this,pmVar7);
                  goto LAB_003f69d1;
                }
              }
              iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
              if (iVar3 != 1) {
LAB_003f6dcd:
                __assert_fail("mReader->getNodeType() == irr::io::EXN_ELEMENT",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Collada/ColladaParser.h"
                              ,0x178,"bool Assimp::ColladaParser::IsElement(const char *) const");
              }
              iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
              iVar3 = strcmp((char *)CONCAT44(extraout_var_03,iVar3),"phong");
              if (iVar3 == 0) {
                pEffect->mShadeType = Shade_Phong;
              }
              else {
                iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
                if (iVar3 != 1) goto LAB_003f6dcd;
                iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
                iVar3 = strcmp((char *)CONCAT44(extraout_var_04,iVar3),"constant");
                if (iVar3 == 0) {
                  pEffect->mShadeType = Shade_Constant;
                }
                else {
                  iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
                  if (iVar3 != 1) goto LAB_003f6dcd;
                  iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
                  iVar3 = strcmp((char *)CONCAT44(extraout_var_05,iVar3),"lambert");
                  if (iVar3 == 0) {
                    pEffect->mShadeType = Shade_Lambert;
                  }
                  else {
                    iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
                    if (iVar3 != 1) goto LAB_003f6dcd;
                    iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
                    iVar3 = strcmp((char *)CONCAT44(extraout_var_06,iVar3),"blinn");
                    if (iVar3 == 0) {
                      pEffect->mShadeType = Shade_Blinn;
                    }
                    else {
                      iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
                      if (iVar3 != 1) goto LAB_003f6dcd;
                      iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
                      iVar3 = strcmp((char *)CONCAT44(extraout_var_07,iVar3),"emission");
                      pSampler = local_40;
                      pColor = local_38;
                      if (iVar3 != 0) {
                        iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
                        if (iVar3 != 1) goto LAB_003f6dcd;
                        iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
                        iVar3 = strcmp((char *)CONCAT44(extraout_var_08,iVar3),"ambient");
                        pSampler = local_50;
                        pColor = local_48;
                        if ((((iVar3 != 0) &&
                             (bVar2 = IsElement(this,"diffuse"), pSampler = local_60,
                             pColor = local_58, !bVar2)) &&
                            (bVar2 = IsElement(this,"specular"), pSampler = local_70,
                            pColor = local_68, !bVar2)) &&
                           (bVar2 = IsElement(this,"reflective"), pSampler = local_80,
                           pColor = local_78, !bVar2)) {
                          bVar2 = IsElement(this,"transparent");
                          if (!bVar2) {
                            bVar2 = IsElement(this,"shininess");
                            pFloat = local_98;
                            if (((bVar2) ||
                                (bVar2 = IsElement(this,"reflectivity"), pFloat = local_a0, bVar2))
                               || ((bVar2 = IsElement(this,"transparency"), pFloat = local_a8, bVar2
                                   || (bVar2 = IsElement(this,"index_of_refraction"),
                                      pFloat = local_b0, bVar2)))) {
                              ReadEffectFloat(this,pFloat);
                            }
                            else {
                              bVar2 = IsElement(this,"double_sided");
                              if (bVar2) {
                                bVar2 = ReadBoolFromTextContent(this);
                                pEffect->mDoubleSided = bVar2;
                              }
                              else {
                                bVar2 = IsElement(this,"bump");
                                if (bVar2) {
                                  local_138 = (undefined1  [8])0x0;
                                  puStack_130 = (undefined8 *)0x0;
                                  pSampler = local_b8;
                                  pColor = (aiColor4D *)local_138;
                                  goto LAB_003f6c67;
                                }
                                bVar2 = IsElement(this,"wireframe");
                                if (bVar2) {
                                  bVar2 = ReadBoolFromTextContent(this);
                                  pEffect->mWireframe = bVar2;
                                  pcVar8 = "wireframe";
                                }
                                else {
                                  bVar2 = IsElement(this,"faceted");
                                  if (!bVar2) {
                                    SkipElement(this);
                                    goto LAB_003f6c6c;
                                  }
                                  bVar2 = ReadBoolFromTextContent(this);
                                  pEffect->mFaceted = bVar2;
                                  pcVar8 = "faceted";
                                }
                                TestClosing(this,pcVar8);
                              }
                            }
                            goto LAB_003f6c6c;
                          }
                          pEffect->mHasTransparency = true;
                          iVar3 = (*this->mReader->_vptr_IIrrXMLReader[8])(this->mReader,"opaque");
                          pcVar8 = (char *)CONCAT44(extraout_var_12,iVar3);
                          iVar3 = strcmp(pcVar8,"RGB_ZERO");
                          if ((iVar3 == 0) || (iVar3 = strcmp(pcVar8,"RGB_ONE"), iVar3 == 0)) {
                            pEffect->mRGBTransparency = true;
                          }
                          iVar3 = strcmp(pcVar8,"RGB_ZERO");
                          if ((iVar3 == 0) ||
                             (iVar3 = strcmp(pcVar8,"A_ZERO"), pSampler = local_90,
                             pColor = local_88, iVar3 == 0)) {
                            pEffect->mInvertTransparency = true;
                            pSampler = local_90;
                            pColor = local_88;
                          }
                        }
                      }
LAB_003f6c67:
                      ReadEffectColor(this,pColor,pSampler);
                    }
                  }
                }
              }
            }
          }
        }
      }
      else if (iVar4 == 2) {
        iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
        iVar3 = strcmp((char *)CONCAT44(extraout_var_09,iVar3),"profile_COMMON");
        if (iVar3 == 0) {
          return;
        }
      }
LAB_003f6c6c:
      iVar3 = (*this->mReader->_vptr_IIrrXMLReader[2])();
    } while ((char)iVar3 != '\0');
  }
  return;
}

Assistant:

void ColladaParser::ReadEffectProfileCommon(Collada::Effect& pEffect)
{
    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT)
        {
            if (IsElement("newparam")) {
                // save ID
                int attrSID = GetAttribute("sid");
                std::string sid = mReader->getAttributeValue(attrSID);
                pEffect.mParams[sid] = EffectParam();
                ReadEffectParam(pEffect.mParams[sid]);
            }
            else if (IsElement("technique") || IsElement("extra"))
            {
                // just syntactic sugar
            }

            else if (mFormat == FV_1_4_n && IsElement("image"))
            {
                // read ID. Another entry which is "optional" by design but obligatory in reality
                int attrID = GetAttribute("id");
                std::string id = mReader->getAttributeValue(attrID);

                // create an entry and store it in the library under its ID
                mImageLibrary[id] = Image();

                // read on from there
                ReadImage(mImageLibrary[id]);
            }

            /* Shading modes */
            else if (IsElement("phong"))
                pEffect.mShadeType = Shade_Phong;
            else if (IsElement("constant"))
                pEffect.mShadeType = Shade_Constant;
            else if (IsElement("lambert"))
                pEffect.mShadeType = Shade_Lambert;
            else if (IsElement("blinn"))
                pEffect.mShadeType = Shade_Blinn;

            /* Color + texture properties */
            else if (IsElement("emission"))
                ReadEffectColor(pEffect.mEmissive, pEffect.mTexEmissive);
            else if (IsElement("ambient"))
                ReadEffectColor(pEffect.mAmbient, pEffect.mTexAmbient);
            else if (IsElement("diffuse"))
                ReadEffectColor(pEffect.mDiffuse, pEffect.mTexDiffuse);
            else if (IsElement("specular"))
                ReadEffectColor(pEffect.mSpecular, pEffect.mTexSpecular);
            else if (IsElement("reflective")) {
                ReadEffectColor(pEffect.mReflective, pEffect.mTexReflective);
            }
            else if (IsElement("transparent")) {
                pEffect.mHasTransparency = true;

                const char* opaque = mReader->getAttributeValueSafe("opaque");

                if (::strcmp(opaque, "RGB_ZERO") == 0 || ::strcmp(opaque, "RGB_ONE") == 0) {
                    pEffect.mRGBTransparency = true;
                }

                // In RGB_ZERO mode, the transparency is interpreted in reverse, go figure...
                if (::strcmp(opaque, "RGB_ZERO") == 0 || ::strcmp(opaque, "A_ZERO") == 0) {
                    pEffect.mInvertTransparency = true;
                }

                ReadEffectColor(pEffect.mTransparent, pEffect.mTexTransparent);
            }
            else if (IsElement("shininess"))
                ReadEffectFloat(pEffect.mShininess);
            else if (IsElement("reflectivity"))
                ReadEffectFloat(pEffect.mReflectivity);

            /* Single scalar properties */
            else if (IsElement("transparency"))
                ReadEffectFloat(pEffect.mTransparency);
            else if (IsElement("index_of_refraction"))
                ReadEffectFloat(pEffect.mRefractIndex);

            // GOOGLEEARTH/OKINO extensions
            // -------------------------------------------------------
            else if (IsElement("double_sided"))
                pEffect.mDoubleSided = ReadBoolFromTextContent();

            // FCOLLADA extensions
            // -------------------------------------------------------
            else if (IsElement("bump")) {
                aiColor4D dummy;
                ReadEffectColor(dummy, pEffect.mTexBump);
            }

            // MAX3D extensions
            // -------------------------------------------------------
            else if (IsElement("wireframe")) {
                pEffect.mWireframe = ReadBoolFromTextContent();
                TestClosing("wireframe");
            }
            else if (IsElement("faceted")) {
                pEffect.mFaceted = ReadBoolFromTextContent();
                TestClosing("faceted");
            }
            else
            {
                // ignore the rest
                SkipElement();
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END) {
            if (strcmp(mReader->getNodeName(), "profile_COMMON") == 0)
            {
                break;
            }
        }
    }
}